

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O2

datetime * __thiscall cppcms::filters::datetime::operator=(datetime *this,datetime *other)

{
  streamable::operator=(&this->time_,&other->time_);
  std::__cxx11::string::_M_assign((string *)&this->tz_);
  return this;
}

Assistant:

datetime const &datetime::operator=(datetime const &other) { time_=other.time_; tz_ = other.tz_; return *this; }